

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O3

aiVector3t<float>
Assimp::FBX::PropertyGet<aiVector3t<float>>
          (PropertyTable *in,string *name,aiVector3t<float> *defaultValue)

{
  Property *pPVar1;
  long lVar2;
  
  pPVar1 = PropertyTable::Get(in,name);
  if (pPVar1 != (Property *)0x0) {
    lVar2 = __dynamic_cast(pPVar1,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,0)
    ;
    if (lVar2 != 0) {
      defaultValue = (aiVector3t<float> *)(lVar2 + 8);
    }
  }
  return *defaultValue;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, const T& defaultValue) {
    const Property* const prop = in.Get(name);
    if( nullptr == prop) {
        return defaultValue;
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        return defaultValue;
    }

    return tprop->Value();
}